

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteThrow(CWriter *this)

{
  pointer pTVar1;
  Newline *in_RDX;
  Newline *u;
  
  pTVar1 = (this->try_catch_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->try_catch_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
      ._M_impl.super__Vector_impl_data._M_start != pTVar1) {
    WriteData(this,"goto ",5);
    WriteData(this,pTVar1[-1].name._M_dataplus._M_p,pTVar1[-1].name._M_string_length);
    (anonymous_namespace)::CWriter::Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [8])"_catch;",u);
    (this->try_catch_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].used = true;
    return;
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [17])"wasm_rt_throw();",in_RDX);
  return;
}

Assistant:

void CWriter::WriteThrow() {
  if (try_catch_stack_.empty()) {
    Write("wasm_rt_throw();", Newline());
  } else {
    Write("goto ", try_catch_stack_.back().name, "_catch;", Newline());
    try_catch_stack_.back().used = true;
  }
}